

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDfs.c
# Opt level: O1

Vec_Vec_t * Abc_DfsLevelized(Abc_Obj_t *pNode,int fTfi)

{
  ulong uVar1;
  int iVar2;
  Abc_Ntk_t *pAVar3;
  uint uVar4;
  int *piVar5;
  Vec_Vec_t *vLevels;
  void **ppvVar6;
  int Fill;
  int iVar7;
  long lVar8;
  
  if (fTfi != 0) {
    __assert_fail("fTfi == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x526,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
  }
  pAVar3 = pNode->pNtk;
  if (pAVar3->ntkType == ABC_NTK_NETLIST) {
    __assert_fail("!Abc_NtkIsNetlist(pNode->pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                  ,0x527,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
  }
  if ((pAVar3->vTravIds).pArray == (int *)0x0) {
    iVar2 = pAVar3->vObjs->nSize;
    uVar1 = (long)iVar2 + 500;
    iVar7 = (int)uVar1;
    if ((pAVar3->vTravIds).nCap < iVar7) {
      piVar5 = (int *)malloc(uVar1 * 4);
      (pAVar3->vTravIds).pArray = piVar5;
      if (piVar5 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x20c,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      (pAVar3->vTravIds).nCap = iVar7;
    }
    if (-500 < iVar2) {
      memset((pAVar3->vTravIds).pArray,0,(uVar1 & 0xffffffff) << 2);
    }
    (pAVar3->vTravIds).nSize = iVar7;
  }
  iVar2 = pAVar3->nTravIds;
  pAVar3->nTravIds = iVar2 + 1;
  if (iVar2 < 0x3fffffff) {
    vLevels = (Vec_Vec_t *)malloc(0x10);
    vLevels->nCap = 100;
    vLevels->nSize = 0;
    ppvVar6 = (void **)malloc(800);
    vLevels->pArray = ppvVar6;
    uVar4 = *(uint *)&pNode->field_0x14 & 0xf;
    if ((uVar4 == 2) || (uVar4 == 5)) {
      pAVar3 = pNode->pNtk;
      iVar2 = pAVar3->nTravIds;
      iVar7 = pNode->Id;
      Vec_IntFillExtra(&pAVar3->vTravIds,iVar7 + 1,Fill);
      if (((long)iVar7 < 0) || ((pAVar3->vTravIds).nSize <= iVar7)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                      ,0x1c0,"void Vec_IntWriteEntry(Vec_Int_t *, int, int)");
      }
      (pAVar3->vTravIds).pArray[iVar7] = iVar2;
      if (0 < (pNode->vFanouts).nSize) {
        lVar8 = 0;
        do {
          Abc_DfsLevelizedTfo_rec
                    ((Abc_Obj_t *)pNode->pNtk->vObjs->pArray[(pNode->vFanouts).pArray[lVar8]],
                     vLevels);
          lVar8 = lVar8 + 1;
        } while (lVar8 < (pNode->vFanouts).nSize);
      }
    }
    else {
      if (uVar4 != 7) {
        __assert_fail("Abc_ObjIsCi(pNode)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcDfs.c"
                      ,0x52f,"Vec_Vec_t *Abc_DfsLevelized(Abc_Obj_t *, int)");
      }
      Abc_DfsLevelizedTfo_rec(pNode,vLevels);
    }
    return vLevels;
  }
  __assert_fail("p->nTravIds < (1<<30)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,0x197,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
}

Assistant:

Vec_Vec_t * Abc_DfsLevelized( Abc_Obj_t * pNode, int fTfi )
{
    Vec_Vec_t * vLevels;
    Abc_Obj_t * pFanout;
    int i;
    assert( fTfi == 0 );
    assert( !Abc_NtkIsNetlist(pNode->pNtk) );
    // set the traversal ID
    Abc_NtkIncrementTravId( pNode->pNtk );
    vLevels = Vec_VecAlloc( 100 );
    if ( Abc_ObjIsNode(pNode) )
        Abc_DfsLevelizedTfo_rec( pNode, vLevels );
    else
    {
        assert( Abc_ObjIsCi(pNode) );
        Abc_NodeSetTravIdCurrent( pNode );
        Abc_ObjForEachFanout( pNode, pFanout, i )
            Abc_DfsLevelizedTfo_rec( pFanout, vLevels );
    }
    return vLevels;
}